

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall
DetectorSS::Query(DetectorSS *this,val_tp thresh,
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *results)

{
  bool bVar1;
  reference puVar2;
  uint in_ESI;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar3;
  pair<unsigned_int,_unsigned_int> node;
  val_tp degree;
  iterator it;
  val_tp est;
  int j;
  int i;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  reset;
  uint in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  pair<unsigned_int,_unsigned_int> local_9c;
  uint local_94;
  _Node_iterator_base<unsigned_int,_false> local_90;
  _Node_iterator_base<unsigned_int,_false> local_88;
  _Node_iterator_base<unsigned_int,_false> local_80;
  undefined1 local_78;
  uint32_t in_stack_ffffffffffffff8c;
  DetectorSS *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x10ac15);
  for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x20); local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x24); local_58 = local_58 + 1) {
      in_stack_ffffffffffffff4c =
           Estimate((DetectorSS *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c,(uchar *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffff4c;
      if (in_ESI <= in_stack_ffffffffffffff4c) {
        pVar3 = std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)in_RDI,
                         (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                        );
        local_80._M_cur =
             (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_78 = pVar3.second;
        in_stack_ffffffffffffff3c = CONCAT13(local_78,(int3)in_stack_ffffffffffffff3c);
      }
    }
  }
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar1 = std::__detail::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
              ((_Node_iterator<unsigned_int,_true,_false> *)0x10ad44);
    in_stack_ffffffffffffff38 = PointQueryMerge(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
    ;
    local_94 = in_stack_ffffffffffffff38;
    if (in_ESI <= in_stack_ffffffffffffff38) {
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>(&local_9c);
      puVar2 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                         ((_Node_iterator<unsigned_int,_true,_false> *)0x10ad7f);
      local_9c.first = *puVar2;
      local_9c.second = local_94;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back(in_RDI,(value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                 );
    }
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
              ((_Node_iterator<unsigned_int,_true,_false> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)0x10adc5);
  return;
}

Assistant:

void DetectorSS::Query(val_tp thresh, std::vector<std::pair<key_tp, val_tp> >& results) {
	std::unordered_set<key_tp> reset;
	for (int i = 0; i < ss_.depth; i++) {
		for (int j = 0; j < ss_.width; j++) {
			val_tp est = Estimate(j, ss_.counts[i]);
			if (est >= thresh) {
				reset.insert(ss_.skey[i][j]);
			}
		}
	}

	for (auto it = reset.begin(); it != reset.end(); it++) {
		val_tp degree = PointQueryMerge(*it);
		if (degree >= thresh) {
			std::pair<key_tp, val_tp> node;
			node.first = *it;
			node.second = degree;
			results.push_back(node);
		}
	}
}